

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O3

void __thiscall
cbtIDebugDraw::drawArc
          (cbtIDebugDraw *this,cbtVector3 *center,cbtVector3 *normal,cbtVector3 *axis,
          cbtScalar radiusA,cbtScalar radiusB,cbtScalar minAngle,cbtScalar maxAngle,
          cbtVector3 *color,bool drawSect,cbtScalar stepDegrees)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  int iVar8;
  undefined3 in_register_00000089;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar17;
  float fVar18;
  undefined1 auVar14 [16];
  float fVar19;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  cbtVector3 prev;
  cbtVector3 next;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  undefined1 local_40 [16];
  
  uVar2 = *(ulong *)(axis->m_floats + 1);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar2;
  fVar11 = axis->m_floats[0];
  auVar15 = vshufps_avx(auVar21,auVar21,0xe1);
  auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)fVar11),0x10);
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx512vl(ZEXT416((uint)((maxAngle - minAngle) / (stepDegrees * 0.017453292))),
                           auVar9);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(normal->m_floats + 1);
  iVar8 = (int)auVar9._0_4_ + (uint)((int)auVar9._0_4_ == 0);
  auVar9 = vpermi2ps_avx512vl(_DAT_009d86b0,auVar14,ZEXT416((uint)normal->m_floats[0]));
  auVar20._0_4_ = (float)uVar2 * auVar9._0_4_;
  auVar20._4_4_ = (float)(uVar2 >> 0x20) * auVar9._4_4_;
  auVar20._8_4_ = auVar9._8_4_ * 0.0;
  auVar20._12_4_ = auVar9._12_4_ * 0.0;
  auVar15 = vfmsub213ps_fma(auVar15,auVar14,auVar20);
  auVar14 = vfmsub231ss_fma(ZEXT416((uint)(fVar11 * (float)*(ulong *)(normal->m_floats + 1))),
                            auVar21,ZEXT416((uint)normal->m_floats[0]));
  auVar9 = vmovshdup_avx(auVar21);
  local_58 = radiusA;
  fVar10 = cosf(minAngle);
  fVar6 = local_58;
  fVar12 = center->m_floats[2];
  local_78 = auVar15._0_4_;
  fStack_74 = auVar15._4_4_;
  fStack_70 = auVar15._8_4_;
  fStack_6c = auVar15._12_4_;
  fVar5 = radiusB * auVar14._0_4_;
  auVar15 = vinsertps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)(float)uVar2),0x1c);
  fVar13 = auVar15._0_4_ * local_58;
  fVar17 = auVar15._4_4_ * local_58;
  fVar18 = auVar15._8_4_ * local_58;
  fVar19 = auVar15._12_4_ * local_58;
  uVar3 = *(undefined8 *)center->m_floats;
  fVar11 = sinf(minAngle);
  auVar15._0_4_ = fVar11 * radiusB * local_78 + (float)uVar3 + fVar13 * fVar10;
  auVar15._4_4_ = fVar11 * radiusB * fStack_74 + (float)((ulong)uVar3 >> 0x20) + fVar17 * fVar10;
  auVar15._8_4_ = fVar11 * radiusB * fStack_70 + fVar18 * fVar10 + 0.0;
  auVar15._12_4_ = fVar11 * radiusB * fStack_6c + fVar19 * fVar10 + 0.0;
  local_68 = vinsertps_avx(auVar15,ZEXT416((uint)(fVar11 * fVar5 +
                                                 fVar10 * auVar9._0_4_ * radiusA + fVar12)),0x28);
  if (CONCAT31(in_register_00000089,drawSect) != 0) {
    (*this->_vptr_cbtIDebugDraw[4])(this,center,local_68,color);
  }
  if (0 < iVar8) {
    iVar7 = 1;
    do {
      fVar12 = ((maxAngle - minAngle) * (float)iVar7) / (float)iVar8 + minAngle;
      fVar10 = local_58 * axis->m_floats[2];
      uVar3 = *(undefined8 *)axis->m_floats;
      fVar13 = cosf(fVar12);
      uVar4 = *(undefined8 *)center->m_floats;
      fVar11 = center->m_floats[2];
      fVar12 = sinf(fVar12);
      auVar16._0_4_ = fVar12 * radiusB * local_78 + (float)uVar4 + fVar13 * (float)uVar3 * fVar6;
      auVar16._4_4_ =
           fVar12 * radiusB * fStack_74 +
           (float)((ulong)uVar4 >> 0x20) + fVar13 * (float)((ulong)uVar3 >> 0x20) * fVar6;
      auVar16._8_4_ = fVar12 * radiusB * fStack_70 + fVar13 * fVar6 * 0.0 + 0.0;
      auVar16._12_4_ = fVar12 * radiusB * fStack_6c + fVar13 * fVar6 * 0.0 + 0.0;
      local_40 = vinsertps_avx(auVar16,ZEXT416((uint)(fVar12 * fVar5 + fVar13 * fVar10 + fVar11)),
                               0x28);
      (*this->_vptr_cbtIDebugDraw[4])(this,local_68,local_40,color);
      iVar1 = (1 - iVar8) + iVar7;
      iVar7 = iVar7 + 1;
      local_68 = local_40;
    } while (iVar1 != 1);
  }
  if (drawSect) {
    (*this->_vptr_cbtIDebugDraw[4])(this,center,local_68,color);
  }
  return;
}

Assistant:

virtual void drawArc(const cbtVector3& center, const cbtVector3& normal, const cbtVector3& axis, cbtScalar radiusA, cbtScalar radiusB, cbtScalar minAngle, cbtScalar maxAngle,
						 const cbtVector3& color, bool drawSect, cbtScalar stepDegrees = cbtScalar(10.f))
	{
		const cbtVector3& vx = axis;
		cbtVector3 vy = normal.cross(axis);
		cbtScalar step = stepDegrees * SIMD_RADS_PER_DEG;
		int nSteps = (int)cbtFabs((maxAngle - minAngle) / step);
		if (!nSteps) nSteps = 1;
		cbtVector3 prev = center + radiusA * vx * cbtCos(minAngle) + radiusB * vy * cbtSin(minAngle);
		if (drawSect)
		{
			drawLine(center, prev, color);
		}
		for (int i = 1; i <= nSteps; i++)
		{
			cbtScalar angle = minAngle + (maxAngle - minAngle) * cbtScalar(i) / cbtScalar(nSteps);
			cbtVector3 next = center + radiusA * vx * cbtCos(angle) + radiusB * vy * cbtSin(angle);
			drawLine(prev, next, color);
			prev = next;
		}
		if (drawSect)
		{
			drawLine(center, prev, color);
		}
	}